

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O0

DdNode * Extra_bddSpaceFromFunction(DdManager *dd,DdNode *bF,DdNode *bG)

{
  DdNode *pDVar1;
  DdNode *bRes;
  DdNode *bG_local;
  DdNode *bF_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    pDVar1 = extraBddSpaceFromFunction(dd,bF,bG);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode * Extra_bddSpaceFromFunction( DdManager * dd, DdNode * bF, DdNode * bG )
{
    DdNode * bRes;
    do {
        dd->reordered = 0;
        bRes = extraBddSpaceFromFunction( dd, bF, bG );
    } while (dd->reordered == 1);
    return bRes;
}